

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateStub
          (ImmutableServiceGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  ClassNameResolver *this_00;
  ServiceDescriptor *pSVar1;
  Nonnull<char_*> pcVar2;
  Descriptor *descriptor;
  long lVar3;
  long lVar4;
  MethodDescriptor *method;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_c8;
  string local_a8;
  ctrl_t *local_78;
  long local_70;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_a8,this->name_resolver_,(this->super_ServiceGenerator).descriptor_,true);
  text._M_str = 
  "public static Stub newStub(\n    com.google.protobuf.RpcChannel channel) {\n  return new Stub(channel);\n}\n\npublic static final class Stub extends $classname$ implements Interface {\n"
  ;
  text._M_len = 0xb3;
  io::Printer::Print<char[10],std::__cxx11::string>(printer,text,(char (*) [10])0x134d25a,&local_a8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_00._M_str =
       "private Stub(com.google.protobuf.RpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.RpcChannel channel;\n\npublic com.google.protobuf.RpcChannel getChannel() {\n  return channel;\n}\n"
  ;
  text_00._M_len = 0xd4;
  io::Printer::Print<>(printer,text_00);
  pSVar1 = (this->super_ServiceGenerator).descriptor_;
  if (0 < pSVar1->method_count_) {
    lVar3 = 0;
    local_78 = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    lVar4 = 0;
    do {
      method = (MethodDescriptor *)(&pSVar1->methods_->super_SymbolBase + lVar3);
      text_01._M_str = "\n";
      text_01._M_len = 1;
      local_70 = lVar3;
      io::Printer::Print<>(printer,text_01);
      GenerateMethodSignature(this,printer,method,IS_CONCRETE);
      text_02._M_str = " {\n";
      text_02._M_len = 3;
      io::Printer::Print<>(printer,text_02);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0;
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.control = local_78;
      buffer = &local_a8.field_2;
      pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                         ((int32_t)lVar4,buffer->_M_local_buf);
      local_a8._M_dataplus._M_p = pcVar2 + -(long)buffer;
      local_c8.first.ctrl_ = &local_c8.second;
      local_a8._M_string_length = (size_type)buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,buffer,pcVar2);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[6]>(&local_48,&local_68,(char (*) [6])0x1104a3a);
      std::__cxx11::string::operator=
                ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_c8);
      if ((bool *)local_c8.first.ctrl_ != &local_c8.second) {
        operator_delete(local_c8.first.ctrl_,local_c8._16_8_ + 1);
      }
      this_00 = this->name_resolver_;
      descriptor = MethodDescriptor::output_type(method);
      ClassNameResolver::GetClassName_abi_cxx11_(&local_a8,this_00,descriptor,true);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[7]>(&local_c8,&local_68,(char (*) [7])0x11e925c);
      std::__cxx11::string::operator=
                ((string *)((long)local_c8.first.field_1.slot_ + 0x10),(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      text_05._M_str =
           "channel.callMethod(\n  getDescriptor().getMethods().get($index$),\n  controller,\n  request,\n  $output$.getDefaultInstance(),\n  com.google.protobuf.RpcUtil.generalizeCallback(\n    done,\n    $output$.class,\n    $output$.getDefaultInstance()));\n"
      ;
      text_05._M_len = 0xf0;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_68,text_05);
      io::Printer::Outdent(printer);
      text_03._M_str = "}\n";
      text_03._M_len = 2;
      io::Printer::Print<>(printer,text_03);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set(&local_68);
      lVar4 = lVar4 + 1;
      pSVar1 = (this->super_ServiceGenerator).descriptor_;
      lVar3 = local_70 + 0x50;
    } while (lVar4 < pSVar1->method_count_);
  }
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n\n";
  text_04._M_len = 3;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateStub(io::Printer* printer) {
  printer->Print(
      "public static Stub newStub(\n"
      "    com.google.protobuf.RpcChannel channel) {\n"
      "  return new Stub(channel);\n"
      "}\n"
      "\n"
      "public static final class Stub extends $classname$ implements Interface "
      "{"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
  printer->Indent();

  printer->Print(
      "private Stub(com.google.protobuf.RpcChannel channel) {\n"
      "  this.channel = channel;\n"
      "}\n"
      "\n"
      "private final com.google.protobuf.RpcChannel channel;\n"
      "\n"
      "public com.google.protobuf.RpcChannel getChannel() {\n"
      "  return channel;\n"
      "}\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(" {\n");
    printer->Indent();

    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["index"] = absl::StrCat(i);
    vars["output"] = GetOutput(method);
    printer->Print(vars,
                   "channel.callMethod(\n"
                   "  getDescriptor().getMethods().get($index$),\n"
                   "  controller,\n"
                   "  request,\n"
                   "  $output$.getDefaultInstance(),\n"
                   "  com.google.protobuf.RpcUtil.generalizeCallback(\n"
                   "    done,\n"
                   "    $output$.class,\n"
                   "    $output$.getDefaultInstance()));\n");

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}